

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeSensInit1(void *cvode_mem,int Ns,int ism,CVSensRhs1Fn fS1,N_Vector *yS0)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  SUNNonlinearSolver NLS;
  long lVar9;
  size_t sVar10;
  int error_code;
  ulong uVar11;
  ulong uVar12;
  char *msgfmt;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  long lVar15;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar16 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar4 = 0x652;
LAB_00114fe7:
    cvProcessError((CVodeMem)cvode_mem,error_code,iVar4,"CVodeSensInit1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,msgfmt);
    return iVar16;
  }
  if (*(int *)((long)cvode_mem + 0x860) != 0) {
    msgfmt = "Sensitivity analysis already initialized.";
    iVar16 = -0x16;
    error_code = -0x16;
    iVar4 = 0x65b;
    goto LAB_00114fe7;
  }
  if (Ns < 1) {
    msgfmt = "NS <= 0 illegal.";
    iVar16 = -0x16;
    error_code = -0x16;
    iVar4 = 0x664;
    goto LAB_00114fe7;
  }
  *(int *)((long)cvode_mem + 0x90) = Ns;
  if (ism - 4U < 0xfffffffd) {
    msgfmt = 
    "Illegal value for ism. Legal values are: CV_SIMULTANEOUS, CV_STAGGERED and CV_STAGGERED1.";
    iVar16 = -0x16;
    error_code = -0x16;
    iVar4 = 0x66e;
    goto LAB_00114fe7;
  }
  *(int *)((long)cvode_mem + 0x94) = ism;
  if (yS0 == (N_Vector *)0x0) {
    msgfmt = "yS0 = NULL illegal.";
    iVar16 = -0x16;
    error_code = -0x16;
    iVar4 = 0x678;
    goto LAB_00114fe7;
  }
  *(undefined4 *)((long)cvode_mem + 0xb4) = 1;
  *(undefined8 *)((long)cvode_mem + 0x98) = 0;
  if (fS1 == (CVSensRhs1Fn)0x0) {
    *(undefined4 *)((long)cvode_mem + 0xb0) = 1;
    *(code **)((long)cvode_mem + 0xa0) = cvSensRhs1InternalDQ;
    pvVar5 = cvode_mem;
  }
  else {
    *(undefined4 *)((long)cvode_mem + 0xb0) = 0;
    *(CVSensRhs1Fn *)((long)cvode_mem + 0xa0) = fS1;
    pvVar5 = *(void **)((long)cvode_mem + 0x18);
  }
  *(void **)((long)cvode_mem + 0xa8) = pvVar5;
  if (ism == 3) {
    *(undefined4 *)((long)cvode_mem + 0x318) = 1;
    *(undefined8 *)((long)cvode_mem + 0x590) = 0;
    pvVar5 = malloc((ulong)(uint)Ns * 4);
    *(void **)((long)cvode_mem + 0x590) = pvVar5;
    *(undefined8 *)((long)cvode_mem + 0x670) = 0;
    sVar10 = (ulong)(uint)Ns << 3;
    pvVar6 = malloc(sVar10);
    *(void **)((long)cvode_mem + 0x670) = pvVar6;
    *(undefined8 *)((long)cvode_mem + 0x688) = 0;
    pvVar7 = malloc(sVar10);
    *(void **)((long)cvode_mem + 0x688) = pvVar7;
    *(undefined8 *)((long)cvode_mem + 0x6a0) = 0;
    pvVar8 = malloc(sVar10);
    *(void **)((long)cvode_mem + 0x6a0) = pvVar8;
    if ((pvVar6 == (void *)0x0 || pvVar5 == (void *)0x0) ||
       (pvVar7 == (void *)0x0 || pvVar8 == (void *)0x0)) {
      msgfmt = "A memory request failed.";
      iVar16 = -0x14;
      error_code = -0x14;
      iVar4 = 0x69f;
      goto LAB_00114fe7;
    }
  }
  else {
    *(undefined4 *)((long)cvode_mem + 0x318) = 0;
  }
  iVar4 = cvSensAllocVectors((CVodeMem)cvode_mem,*yS0);
  if (iVar4 == 0) {
    if (*(int *)((long)cvode_mem + 0x318) != 0) {
      free(*(void **)((long)cvode_mem + 0x590));
      *(undefined8 *)((long)cvode_mem + 0x590) = 0;
      free(*(void **)((long)cvode_mem + 0x670));
      *(undefined8 *)((long)cvode_mem + 0x670) = 0;
      free(*(void **)((long)cvode_mem + 0x688));
      *(undefined8 *)((long)cvode_mem + 0x688) = 0;
      free(*(void **)((long)cvode_mem + 0x6a0));
      *(undefined8 *)((long)cvode_mem + 0x6a0) = 0;
    }
    msgfmt = "A memory request failed.";
    iVar16 = -0x14;
    error_code = -0x14;
    iVar4 = 0x6b6;
    goto LAB_00114fe7;
  }
  if (Ns != 1) {
    free(*(void **)((long)cvode_mem + 0xa50));
    *(undefined8 *)((long)cvode_mem + 0xa50) = 0;
    free(*(void **)((long)cvode_mem + 0xa58));
    *(undefined8 *)((long)cvode_mem + 0xa58) = 0;
    free(*(void **)((long)cvode_mem + 0xa60));
    *(undefined8 *)((long)cvode_mem + 0xa60) = 0;
    sVar10 = (ulong)(uint)(Ns * 0xd) << 3;
    pvVar5 = malloc(sVar10);
    *(void **)((long)cvode_mem + 0xa50) = pvVar5;
    pvVar6 = malloc(sVar10);
    *(void **)((long)cvode_mem + 0xa58) = pvVar6;
    pvVar7 = malloc(sVar10);
    *(void **)((long)cvode_mem + 0xa60) = pvVar7;
    if ((pvVar5 == (void *)0x0) || (pvVar6 == (void *)0x0 || pvVar7 == (void *)0x0)) {
      if (*(int *)((long)cvode_mem + 0x318) != 0) {
        free(*(void **)((long)cvode_mem + 0x590));
        *(undefined8 *)((long)cvode_mem + 0x590) = 0;
        free(*(void **)((long)cvode_mem + 0x670));
        *(undefined8 *)((long)cvode_mem + 0x670) = 0;
        free(*(void **)((long)cvode_mem + 0x688));
        *(undefined8 *)((long)cvode_mem + 0x688) = 0;
        free(*(void **)((long)cvode_mem + 0x6a0));
        *(undefined8 *)((long)cvode_mem + 0x6a0) = 0;
      }
      cvSensFreeVectors((CVodeMem)cvode_mem);
      msgfmt = "A memory request failed.";
      iVar16 = -0x14;
      error_code = -0x14;
      iVar4 = 0x6d8;
      goto LAB_00114fe7;
    }
  }
  auVar3 = _DAT_00138040;
  lVar1 = *(long *)((long)cvode_mem + 0xa50);
  uVar11 = 1;
  if (1 < Ns) {
    uVar11 = (ulong)(uint)Ns;
  }
  lVar9 = uVar11 - 1;
  auVar13._8_4_ = (int)lVar9;
  auVar13._0_8_ = lVar9;
  auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
  lVar9 = 0;
  auVar13 = auVar13 ^ _DAT_00138040;
  auVar14 = _DAT_00138030;
  do {
    bVar2 = auVar13._0_4_ < SUB164(auVar14 ^ auVar3,0);
    iVar4 = auVar13._4_4_;
    iVar16 = SUB164(auVar14 ^ auVar3,4);
    if ((bool)(~(iVar4 < iVar16 || iVar16 == iVar4 && bVar2) & 1)) {
      *(undefined8 *)(lVar1 + lVar9) = 0x3ff0000000000000;
    }
    if (iVar4 >= iVar16 && (iVar16 != iVar4 || !bVar2)) {
      *(undefined8 *)(lVar1 + 8 + lVar9) = 0x3ff0000000000000;
    }
    lVar15 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 2;
    auVar14._8_8_ = lVar15 + 2;
    lVar9 = lVar9 + 0x10;
  } while ((ulong)((int)uVar11 + 1U & 0xfffffffe) << 3 != lVar9);
  iVar4 = N_VScaleVectorArray(Ns,*(undefined8 *)((long)cvode_mem + 0xa50),yS0,
                              *(undefined8 *)((long)cvode_mem + 0x288));
  if (iVar4 != 0) {
    return -0x1c;
  }
  *(undefined8 *)((long)cvode_mem + 0x668) = 0;
  *(undefined8 *)((long)cvode_mem + 0x6b8) = 0;
  *(undefined8 *)((long)cvode_mem + 0x680) = 0;
  *(undefined8 *)((long)cvode_mem + 0x698) = 0;
  *(undefined8 *)((long)cvode_mem + 0x6d0) = 0;
  *(undefined1 (*) [16])((long)cvode_mem + 0x640) = (undefined1  [16])0x0;
  if (ism == 3) {
    lVar1 = *(long *)((long)cvode_mem + 0x670);
    lVar9 = *(long *)((long)cvode_mem + 0x688);
    lVar15 = *(long *)((long)cvode_mem + 0x6a0);
    uVar12 = 0;
    do {
      *(undefined8 *)(lVar1 + uVar12 * 8) = 0;
      *(undefined8 *)(lVar9 + uVar12 * 8) = 0;
      *(undefined8 *)(lVar15 + uVar12 * 8) = 0;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  lVar1 = *(long *)((long)cvode_mem + 0xc0);
  lVar9 = *(long *)((long)cvode_mem + 200);
  uVar11 = 1;
  if (1 < Ns) {
    uVar11 = (ulong)(uint)Ns;
  }
  uVar12 = 0;
  do {
    *(int *)(lVar9 + uVar12 * 4) = (int)uVar12;
    *(undefined8 *)(lVar1 + uVar12 * 8) = 0x3ff0000000000000;
    uVar12 = uVar12 + 1;
  } while (uVar11 != uVar12);
  *(undefined4 *)((long)cvode_mem + 0x8c) = 1;
  *(undefined4 *)((long)cvode_mem + 0x860) = 1;
  if (ism == 1) {
    Ns = Ns + 1;
  }
  else if (ism != 2) {
    NLS = SUNNonlinSol_Newton(*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
    goto LAB_00115563;
  }
  NLS = SUNNonlinSol_NewtonSens(Ns,*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
LAB_00115563:
  if (NLS == (SUNNonlinearSolver)0x0) {
    cvProcessError((CVodeMem)cvode_mem,-0x14,0x717,"CVodeSensInit1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"A memory request failed.");
    cvSensFreeVectors((CVodeMem)cvode_mem);
    return -0x14;
  }
  if (ism == 1) {
    iVar4 = CVodeSetNonlinearSolverSensSim(cvode_mem,NLS);
  }
  else if (ism == 2) {
    iVar4 = CVodeSetNonlinearSolverSensStg(cvode_mem,NLS);
  }
  else {
    iVar4 = CVodeSetNonlinearSolverSensStg1(cvode_mem,NLS);
  }
  if (iVar4 != 0) {
    cvProcessError((CVodeMem)cvode_mem,iVar4,0x72b,"CVodeSensInit1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Setting the nonlinear solver failed");
    cvSensFreeVectors((CVodeMem)cvode_mem);
    SUNNonlinSolFree(NLS);
    return -0x14;
  }
  if (ism == 1) {
    *(undefined4 *)((long)cvode_mem + 0x740) = 1;
  }
  else if (ism == 2) {
    *(undefined4 *)((long)cvode_mem + 0x750) = 1;
  }
  else {
    *(undefined4 *)((long)cvode_mem + 0x760) = 1;
  }
  return 0;
}

Assistant:

int CVodeSensInit1(void* cvode_mem, int Ns, int ism, CVSensRhs1Fn fS1,
                   N_Vector* yS0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  int is, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if CVodeSensInit or CVodeSensInit1 was already called */

  if (cv_mem->cv_SensMallocDone)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_SENSINIT_2);
    return (CV_ILL_INPUT);
  }

  /* Check if Ns is legal */

  if (Ns <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NS);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_Ns = Ns;

  /* Check if ism is legal */

  if ((ism != CV_SIMULTANEOUS) && (ism != CV_STAGGERED) && (ism != CV_STAGGERED1))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_ism = ism;

  /* Check if yS0 is non-null */

  if (yS0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_YS0);
    return (CV_ILL_INPUT);
  }

  /* Store sensitivity RHS-related data */

  cv_mem->cv_ifS = CV_ONESENS;
  cv_mem->cv_fS  = NULL;

  if (fS1 == NULL)
  {
    cv_mem->cv_fSDQ    = SUNTRUE;
    cv_mem->cv_fS1     = cvSensRhs1InternalDQ;
    cv_mem->cv_fS_data = cvode_mem;
  }
  else
  {
    cv_mem->cv_fSDQ    = SUNFALSE;
    cv_mem->cv_fS1     = fS1;
    cv_mem->cv_fS_data = cv_mem->cv_user_data;
  }

  /* Allocate ncfS1, ncfnS1, and nniS1 if needed */

  if (ism == CV_STAGGERED1)
  {
    cv_mem->cv_stgr1alloc = SUNTRUE;
    cv_mem->cv_ncfS1      = NULL;
    cv_mem->cv_ncfS1      = (int*)malloc(Ns * sizeof(int));
    cv_mem->cv_ncfnS1     = NULL;
    cv_mem->cv_ncfnS1     = (long int*)malloc(Ns * sizeof(long int));
    cv_mem->cv_nniS1      = NULL;
    cv_mem->cv_nniS1      = (long int*)malloc(Ns * sizeof(long int));
    cv_mem->cv_nnfS1      = NULL;
    cv_mem->cv_nnfS1      = (long int*)malloc(Ns * sizeof(long int));
    if ((cv_mem->cv_ncfS1 == NULL) || (cv_mem->cv_ncfnS1 == NULL) ||
        (cv_mem->cv_nniS1 == NULL) || (cv_mem->cv_nnfS1 == NULL))
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }
  else { cv_mem->cv_stgr1alloc = SUNFALSE; }

  /* Allocate the vectors (using yS0[0] as a template) */

  allocOK = cvSensAllocVectors(cv_mem, yS0[0]);
  if (!allocOK)
  {
    if (cv_mem->cv_stgr1alloc)
    {
      free(cv_mem->cv_ncfS1);
      cv_mem->cv_ncfS1 = NULL;
      free(cv_mem->cv_ncfnS1);
      cv_mem->cv_ncfnS1 = NULL;
      free(cv_mem->cv_nniS1);
      cv_mem->cv_nniS1 = NULL;
      free(cv_mem->cv_nnfS1);
      cv_mem->cv_nnfS1 = NULL;
    }
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Check if larger temporary work arrays are needed for fused vector ops */
  if (Ns * L_MAX > L_MAX)
  {
    free(cv_mem->cv_cvals);
    cv_mem->cv_cvals = NULL;
    free(cv_mem->cv_Xvecs);
    cv_mem->cv_Xvecs = NULL;
    free(cv_mem->cv_Zvecs);
    cv_mem->cv_Zvecs = NULL;

    cv_mem->cv_cvals = (sunrealtype*)malloc((Ns * L_MAX) * sizeof(sunrealtype));
    cv_mem->cv_Xvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));
    cv_mem->cv_Zvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));

    if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
        (cv_mem->cv_Zvecs == NULL))
    {
      if (cv_mem->cv_stgr1alloc)
      {
        free(cv_mem->cv_ncfS1);
        cv_mem->cv_ncfS1 = NULL;
        free(cv_mem->cv_ncfnS1);
        cv_mem->cv_ncfnS1 = NULL;
        free(cv_mem->cv_nniS1);
        cv_mem->cv_nniS1 = NULL;
        free(cv_mem->cv_nnfS1);
        cv_mem->cv_nnfS1 = NULL;
      }
      cvSensFreeVectors(cv_mem);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }

  /*----------------------------------------------
    All error checking is complete at this point
    -----------------------------------------------*/

  /* Initialize znS[0] in the history array */

  for (is = 0; is < Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(Ns, cv_mem->cv_cvals, yS0, cv_mem->cv_znS[0]);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* Initialize all sensitivity related counters */

  cv_mem->cv_nfSe     = 0;
  cv_mem->cv_nfeS     = 0;
  cv_mem->cv_ncfnS    = 0;
  cv_mem->cv_netfS    = 0;
  cv_mem->cv_nniS     = 0;
  cv_mem->cv_nnfS     = 0;
  cv_mem->cv_nsetupsS = 0;
  if (ism == CV_STAGGERED1)
  {
    for (is = 0; is < Ns; is++)
    {
      cv_mem->cv_ncfnS1[is] = 0;
      cv_mem->cv_nniS1[is]  = 0;
      cv_mem->cv_nnfS1[is]  = 0;
    }
  }

  /* Set default values for plist and pbar */

  for (is = 0; is < Ns; is++)
  {
    cv_mem->cv_plist[is] = is;
    cv_mem->cv_pbar[is]  = ONE;
  }

  /* Sensitivities will be computed */

  cv_mem->cv_sensi          = SUNTRUE;
  cv_mem->cv_SensMallocDone = SUNTRUE;

  /* create a Newton nonlinear solver object by default */
  if (ism == CV_SIMULTANEOUS)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns + 1, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else if (ism == CV_STAGGERED)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else { NLS = SUNNonlinSol_Newton(cv_mem->cv_acor, cv_mem->cv_sunctx); }

  /* check that the nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvSensFreeVectors(cv_mem);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  if (ism == CV_SIMULTANEOUS)
  {
    retval = CVodeSetNonlinearSolverSensSim(cv_mem, NLS);
  }
  else if (ism == CV_STAGGERED)
  {
    retval = CVodeSetNonlinearSolverSensStg(cv_mem, NLS);
  }
  else { retval = CVodeSetNonlinearSolverSensStg1(cv_mem, NLS); }

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvSensFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  if (ism == CV_SIMULTANEOUS) { cv_mem->ownNLSsim = SUNTRUE; }
  else if (ism == CV_STAGGERED) { cv_mem->ownNLSstg = SUNTRUE; }
  else { cv_mem->ownNLSstg1 = SUNTRUE; }

  /* Sensitivity initialization was successfull */
  return (CV_SUCCESS);
}